

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

void linfini2(mcmcxdef *mctx,linfdef *linf,char *filename,int flen,osfildef *fp,int new_line_records
             )

{
  int in_ECX;
  code *pcVar1;
  void *in_RDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  int in_R9D;
  
  *in_RSI = linfget;
  in_RSI[1] = linfcls;
  in_RSI[2] = linfppos;
  pcVar1 = linfglop;
  if (in_R9D != 0) {
    pcVar1 = linfglop2;
  }
  in_RSI[3] = pcVar1;
  in_RSI[4] = linfwrt;
  in_RSI[5] = linfcmp;
  in_RSI[6] = linfact;
  in_RSI[7] = linfdis;
  in_RSI[8] = linftell;
  in_RSI[9] = linfseek;
  in_RSI[10] = linfread;
  in_RSI[0xb] = linfpadd;
  in_RSI[0xc] = linfqtop;
  in_RSI[0xd] = linfgets;
  in_RSI[0xe] = linfnam;
  in_RSI[0x14] = linflnum;
  in_RSI[0xf] = linffind;
  in_RSI[0x10] = linfgoto;
  in_RSI[0x11] = linfofs;
  in_RSI[0x12] = linfren;
  in_RSI[0x13] = linfdelnum;
  in_RSI[0x18] = in_RSI + 0x1b;
  *(undefined2 *)(in_RSI + 0x19) = 0;
  memcpy(in_RSI + 0x4d,in_RDX,(long)in_ECX);
  *(undefined1 *)((long)in_RSI + (long)in_ECX + 0x268) = 0;
  *(undefined1 *)(in_RSI + 0x1b) = 0;
  *(undefined4 *)((long)in_RSI + 0x13c) = 0;
  *(undefined4 *)(in_RSI + 0x28) = 0;
  in_RSI[0x1a] = in_R8;
  in_RSI[0x29] = 0;
  *(undefined2 *)((long)in_RSI + 0xcc) = 4;
  in_RSI[0x2b] = in_RDI;
  in_RSI[0x4c] = 0;
  return;
}

Assistant:

void linfini2(mcmcxdef *mctx, linfdef *linf,
              char *filename, int flen, osfildef *fp, int new_line_records)
{
    /* set up method pointers */
    linf->linflin.lingetp = linfget;
    linf->linflin.linclsp = linfcls;
    linf->linflin.linppos = linfppos;
    linf->linflin.linglop = (new_line_records ? linfglop2 : linfglop);
    linf->linflin.linwrtp = linfwrt;
    linf->linflin.lincmpp = linfcmp;
    linf->linflin.linactp = linfact;
    linf->linflin.lindisp = linfdis;
    linf->linflin.lintellp = linftell;
    linf->linflin.linseekp = linfseek;
    linf->linflin.linreadp = linfread;
    linf->linflin.linpaddp = linfpadd;
    linf->linflin.linqtopp = linfqtop;
    linf->linflin.lingetsp = linfgets;
    linf->linflin.linnamp = linfnam;
    linf->linflin.linlnump = linflnum;
    linf->linflin.linfindp = linffind;
    linf->linflin.lingotop = linfgoto;
    linf->linflin.linofsp = linfofs;
    linf->linflin.linrenp = linfren;
    linf->linflin.lindelp = linfdelnum;

    /* set up instance data */
    linf->linflin.linbuf = linf->linfbuf;
    linf->linflin.linflg = 0;
    memcpy(linf->linfnam, filename, (size_t)flen);
    linf->linfnam[flen] = '\0';
    linf->linfbuf[0] = '\0';
    linf->linfbufnxt = 0;
    linf->linfnxtlen = 0;
    linf->linffp = fp;
    linf->linfnum = 0;
    linf->linflin.linlln = 4;     /* OPCLINE operand is seek offset in file */
    linf->linfmem = mctx;                    /* save memory manager context */
    linf->linfcrec = 0;                  /* no debugger records written yet */
}